

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O0

void wasm::makeClampLimitLiterals<unsigned_long,float>(Literal *iMin,Literal *fMin,Literal *fMax)

{
  float local_a4;
  float local_94;
  Literal local_88;
  Literal local_70;
  Literal local_48;
  unsigned_long local_30;
  unsigned_long maxVal;
  unsigned_long minVal;
  Literal *fMax_local;
  Literal *fMin_local;
  Literal *iMin_local;
  
  minVal = (unsigned_long)fMax;
  fMax_local = fMin;
  fMin_local = iMin;
  maxVal = std::numeric_limits<unsigned_long>::min();
  local_30 = std::numeric_limits<unsigned_long>::max();
  Literal::Literal(&local_48,maxVal);
  Literal::operator=(fMin_local,&local_48);
  Literal::~Literal(&local_48);
  local_94 = (float)maxVal;
  Literal::Literal(&local_70,local_94 + -1.0);
  Literal::operator=(fMax_local,&local_70);
  Literal::~Literal(&local_70);
  local_a4 = (float)local_30;
  Literal::Literal(&local_88,local_a4 + 1.0);
  Literal::operator=((Literal *)minVal,&local_88);
  Literal::~Literal(&local_88);
  return;
}

Assistant:

void makeClampLimitLiterals(Literal& iMin, Literal& fMin, Literal& fMax) {
  IntType minVal = std::numeric_limits<IntType>::min();
  IntType maxVal = std::numeric_limits<IntType>::max();
  iMin = Literal(minVal);
  fMin = Literal(FloatType(minVal) - 1);
  fMax = Literal(FloatType(maxVal) + 1);
}